

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ServiceDescriptor * perfetto::protos::gen::ProducerPort::NewDescriptor(void)

{
  ServiceDescriptor *this;
  Method local_190;
  Method local_170;
  Method local_150;
  Method local_130;
  Method local_110;
  Method local_f0;
  Method local_d0;
  Method local_b0;
  Method local_90;
  Method local_70;
  Method local_50;
  Method local_30;
  ServiceDescriptor *local_10;
  ServiceDescriptor *desc;
  
  this = (ServiceDescriptor *)operator_new(0x20);
  memset(this,0,0x20);
  ipc::ServiceDescriptor::ServiceDescriptor(this);
  this->service_name = "ProducerPort";
  local_30.name = "InitializeConnection";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::InitializeConnectionResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::InitializeConnectionRequest,_perfetto::protos::gen::InitializeConnectionResponse,_&perfetto::protos::gen::ProducerPort::InitializeConnection>
  ;
  local_10 = this;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&this->methods,&local_30);
  local_50.name = "RegisterDataSource";
  local_50.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceRequest>;
  local_50.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterDataSourceResponse>;
  local_50.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterDataSourceRequest,_perfetto::protos::gen::RegisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::RegisterDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_50);
  local_70.name = "UnregisterDataSource";
  local_70.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceRequest>;
  local_70.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterDataSourceResponse>;
  local_70.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterDataSourceRequest,_perfetto::protos::gen::UnregisterDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UnregisterDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_70);
  local_90.name = "CommitData";
  local_90.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataRequest>;
  local_90.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::CommitDataResponse>;
  local_90.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::CommitDataRequest,_perfetto::protos::gen::CommitDataResponse,_&perfetto::protos::gen::ProducerPort::CommitData>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_90);
  local_b0.name = "GetAsyncCommand";
  local_b0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandRequest>;
  local_b0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetAsyncCommandResponse>;
  local_b0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::GetAsyncCommandRequest,_perfetto::protos::gen::GetAsyncCommandResponse,_&perfetto::protos::gen::ProducerPort::GetAsyncCommand>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_b0);
  local_d0.name = "RegisterTraceWriter";
  local_d0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterRequest>;
  local_d0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::RegisterTraceWriterResponse>;
  local_d0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::RegisterTraceWriterRequest,_perfetto::protos::gen::RegisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::RegisterTraceWriter>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_d0);
  local_f0.name = "UnregisterTraceWriter";
  local_f0.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterRequest>
  ;
  local_f0.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UnregisterTraceWriterResponse>;
  local_f0.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UnregisterTraceWriterRequest,_perfetto::protos::gen::UnregisterTraceWriterResponse,_&perfetto::protos::gen::ProducerPort::UnregisterTraceWriter>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_f0);
  local_110.name = "NotifyDataSourceStarted";
  local_110.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedRequest>;
  local_110.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStartedResponse>;
  local_110.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStartedRequest,_perfetto::protos::gen::NotifyDataSourceStartedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStarted>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_110);
  local_130.name = "NotifyDataSourceStopped";
  local_130.request_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedRequest>;
  local_130.reply_proto_decoder =
       _IPC_Decoder<perfetto::protos::gen::NotifyDataSourceStoppedResponse>;
  local_130.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::NotifyDataSourceStoppedRequest,_perfetto::protos::gen::NotifyDataSourceStoppedResponse,_&perfetto::protos::gen::ProducerPort::NotifyDataSourceStopped>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_130);
  local_150.name = "ActivateTriggers";
  local_150.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersRequest>;
  local_150.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ActivateTriggersResponse>;
  local_150.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::ActivateTriggersRequest,_perfetto::protos::gen::ActivateTriggersResponse,_&perfetto::protos::gen::ProducerPort::ActivateTriggers>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_150);
  local_170.name = "Sync";
  local_170.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncRequest>;
  local_170.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SyncResponse>;
  local_170.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::SyncRequest,_perfetto::protos::gen::SyncResponse,_&perfetto::protos::gen::ProducerPort::Sync>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_170);
  local_190.name = "UpdateDataSource";
  local_190.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceRequest>;
  local_190.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::UpdateDataSourceResponse>;
  local_190.invoker =
       _IPC_Invoker<perfetto::protos::gen::ProducerPort,_perfetto::protos::gen::UpdateDataSourceRequest,_perfetto::protos::gen::UpdateDataSourceResponse,_&perfetto::protos::gen::ProducerPort::UpdateDataSource>
  ;
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::emplace_back<perfetto::ipc::ServiceDescriptor::Method>(&local_10->methods,&local_190);
  std::
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ::shrink_to_fit(&local_10->methods);
  return local_10;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ProducerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ProducerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "InitializeConnection",
     &_IPC_Decoder<InitializeConnectionRequest>,
     &_IPC_Decoder<InitializeConnectionResponse>,
     &_IPC_Invoker<ProducerPort, InitializeConnectionRequest, InitializeConnectionResponse, &ProducerPort::InitializeConnection>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterDataSource",
     &_IPC_Decoder<RegisterDataSourceRequest>,
     &_IPC_Decoder<RegisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, RegisterDataSourceRequest, RegisterDataSourceResponse, &ProducerPort::RegisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterDataSource",
     &_IPC_Decoder<UnregisterDataSourceRequest>,
     &_IPC_Decoder<UnregisterDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterDataSourceRequest, UnregisterDataSourceResponse, &ProducerPort::UnregisterDataSource>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "CommitData",
     &_IPC_Decoder<CommitDataRequest>,
     &_IPC_Decoder<CommitDataResponse>,
     &_IPC_Invoker<ProducerPort, CommitDataRequest, CommitDataResponse, &ProducerPort::CommitData>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetAsyncCommand",
     &_IPC_Decoder<GetAsyncCommandRequest>,
     &_IPC_Decoder<GetAsyncCommandResponse>,
     &_IPC_Invoker<ProducerPort, GetAsyncCommandRequest, GetAsyncCommandResponse, &ProducerPort::GetAsyncCommand>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "RegisterTraceWriter",
     &_IPC_Decoder<RegisterTraceWriterRequest>,
     &_IPC_Decoder<RegisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, RegisterTraceWriterRequest, RegisterTraceWriterResponse, &ProducerPort::RegisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UnregisterTraceWriter",
     &_IPC_Decoder<UnregisterTraceWriterRequest>,
     &_IPC_Decoder<UnregisterTraceWriterResponse>,
     &_IPC_Invoker<ProducerPort, UnregisterTraceWriterRequest, UnregisterTraceWriterResponse, &ProducerPort::UnregisterTraceWriter>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStarted",
     &_IPC_Decoder<NotifyDataSourceStartedRequest>,
     &_IPC_Decoder<NotifyDataSourceStartedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStartedRequest, NotifyDataSourceStartedResponse, &ProducerPort::NotifyDataSourceStarted>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "NotifyDataSourceStopped",
     &_IPC_Decoder<NotifyDataSourceStoppedRequest>,
     &_IPC_Decoder<NotifyDataSourceStoppedResponse>,
     &_IPC_Invoker<ProducerPort, NotifyDataSourceStoppedRequest, NotifyDataSourceStoppedResponse, &ProducerPort::NotifyDataSourceStopped>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ActivateTriggers",
     &_IPC_Decoder<ActivateTriggersRequest>,
     &_IPC_Decoder<ActivateTriggersResponse>,
     &_IPC_Invoker<ProducerPort, ActivateTriggersRequest, ActivateTriggersResponse, &ProducerPort::ActivateTriggers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Sync",
     &_IPC_Decoder<SyncRequest>,
     &_IPC_Decoder<SyncResponse>,
     &_IPC_Invoker<ProducerPort, SyncRequest, SyncResponse, &ProducerPort::Sync>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "UpdateDataSource",
     &_IPC_Decoder<UpdateDataSourceRequest>,
     &_IPC_Decoder<UpdateDataSourceResponse>,
     &_IPC_Invoker<ProducerPort, UpdateDataSourceRequest, UpdateDataSourceResponse, &ProducerPort::UpdateDataSource>});
  desc->methods.shrink_to_fit();
  return desc;
}